

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaJsonWriter::WriteNumber(VmaJsonWriter *this,uint32_t n)

{
  undefined8 in_RDI;
  uint32_t num;
  VmaJsonWriter *unaff_retaddr;
  
  num = (uint32_t)((ulong)in_RDI >> 0x20);
  BeginValue(unaff_retaddr,SUB81((ulong)in_RDI >> 0x38,0));
  VmaStringBuilder::AddNumber((VmaStringBuilder *)unaff_retaddr,num);
  return;
}

Assistant:

void VmaJsonWriter::WriteNumber(uint32_t n)
{
    VMA_ASSERT(!m_InsideString);
    BeginValue(false);
    m_SB.AddNumber(n);
}